

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

char * Am_Merge_Pathname(char *name)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *__dest;
  char *__src;
  char *ret_val;
  Am_Filename local_58;
  undefined1 local_31;
  undefined1 local_30 [7];
  bool ok;
  Am_Filename found;
  char *name_local;
  
  found._24_8_ = name;
  Am_Filename::Am_Filename((Am_Filename *)local_30);
  Am_Filename::Am_Filename(&local_58,(char *)found._24_8_);
  bVar1 = Am_Data_Locator::Find_File(&Am_Default_Data_Locator,&local_58,(Am_Filename *)local_30);
  Am_Filename::~Am_Filename(&local_58);
  local_31 = bVar1;
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to locate file \'");
    poVar2 = std::operator<<(poVar2,(char *)found._24_8_);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  Am_Filename::name_abi_cxx11_((Am_Filename *)local_30);
  lVar3 = std::__cxx11::string::length();
  __dest = (char *)operator_new__(lVar3 + 1);
  __src = Am_Filename::c_str((Am_Filename *)local_30);
  strcpy(__dest,__src);
  Am_Filename::~Am_Filename((Am_Filename *)local_30);
  return __dest;
}

Assistant:

const char *
Am_Merge_Pathname(const char *name)
{
#if 0
  const char *am_dir = Am_Get_Amulet_Pathname();
  if (!am_dir) am_dir = "..";
  char *ret_val = new char [(strlen(am_dir) + strlen(name) + 2)];

  strcpy(ret_val, am_dir);
  strcat(ret_val, "/");
  strcat(ret_val, name);
  return ret_val;
#else
  Am_Filename found;
  const bool ok = Am_Default_Data_Locator.Find_File(name, found);
  if (!ok) {
    std::cout << "Unable to locate file '" << name << "'" << std::endl;
  }
  char *ret_val = new char[found.name().length() + 1];
  strcpy(ret_val, found.c_str());
  return ret_val;
#endif
}